

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdFreeTaprootScriptTreeHandle(void *handle,void *tree_handle)

{
  vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> *this;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this_00;
  allocator local_41;
  string local_40;
  
  cfd::Initialize();
  if (tree_handle != (void *)0x0) {
    std::__cxx11::string::string((string *)&local_40,"TapscriptTree",&local_41);
    cfd::capi::CheckBuffer(tree_handle,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this = *(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> **)
            ((long)tree_handle + 0x10);
    if (this != (vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                 *)0x0) {
      std::vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
      ~vector(this);
      operator_delete(this,0x18);
      *(undefined8 *)((long)tree_handle + 0x10) = 0;
    }
    this_00 = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
               ((long)tree_handle + 0x18);
    if (this_00 != (vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)0x0) {
      std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(this_00);
      operator_delete(this_00,0x18);
      *(undefined8 *)((long)tree_handle + 0x18) = 0;
    }
    std::__cxx11::string::string((string *)&local_40,"TapscriptTree",&local_41);
    cfd::capi::FreeBuffer(tree_handle,&local_40,0x28);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return 0;
}

Assistant:

int CfdFreeTaprootScriptTreeHandle(void* handle, void* tree_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (tree_handle != nullptr) {
      CheckBuffer(tree_handle, kPrefixTapscriptTree);
      CfdCapiTapscriptTree* data =
          static_cast<CfdCapiTapscriptTree*>(tree_handle);
      if (data->tree_buffer != nullptr) {
        delete data->tree_buffer;
        data->tree_buffer = nullptr;
      }
      if (data->branch_buffer != nullptr) {
        delete data->branch_buffer;
        data->branch_buffer = nullptr;
      }
      FreeBuffer(
          tree_handle, kPrefixTapscriptTree, sizeof(CfdCapiTapscriptTree));
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}